

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

uint32_t __thiscall ast::Section::read32(Section *this,uint offset)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = this->content_size;
  if (offset < uVar1) {
    uVar3 = (uint)this->content[offset];
  }
  else {
    uVar3 = 0x55;
  }
  uVar2 = 0x5500;
  if (offset + 1 < uVar1) {
    uVar2 = (uint)this->content[(ulong)offset + 1] << 8;
  }
  iVar4 = 0x550000;
  if (offset + 2 < uVar1) {
    iVar4 = (uint)this->content[(ulong)offset + 2] << 0x10;
  }
  iVar5 = 0x55000000;
  if (offset + 3 < uVar1) {
    iVar5 = (uint)this->content[(ulong)offset + 3] << 0x18;
  }
  return (uVar2 | uVar3) + iVar4 + iVar5;
}

Assistant:

uint32_t Section::read32(unsigned offset)
{
	uint32_t byte0 = 0x55, byte1 = 0x55, byte2 = 0x55, byte3 = 0x55;
	if (offset < content_size)
		byte0 = *(content + offset);
	if (offset + 1 < content_size)
		byte1 = *(content + offset + 1);
	if (offset + 2 < content_size)
		byte2 = *(content + offset + 2);
	if (offset + 3 < content_size)
		byte3 = *(content + offset + 3);
	return (byte3 << 24) + (byte2 << 16) + (byte1 << 8) + byte0;
}